

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_cfg_read(stb_cfg *z,char *key,void *value,int len)

{
  stb__cfg_item *psVar1;
  int iVar2;
  stb__cfg_item *psVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  stb__cfg_item *psVar7;
  
  psVar1 = z->data;
  lVar6 = -1;
  psVar3 = psVar1;
  while( true ) {
    psVar7 = psVar3;
    if (psVar1 == (stb__cfg_item *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)*(int *)&psVar1[-1].value;
    }
    lVar6 = lVar6 + 1;
    if (lVar5 <= lVar6) break;
    iVar4 = strcasecmp(psVar7->key,key);
    psVar3 = psVar7 + 1;
    if (iVar4 == 0) {
      iVar4 = psVar7->value_len;
      iVar2 = len;
      if (iVar4 < len) {
        iVar2 = iVar4;
      }
      memcpy(value,psVar7->value,(long)iVar2);
      if (iVar4 < len) {
        *(undefined1 *)((long)value + (long)iVar2) = 0;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int stb_cfg_read(stb_cfg *z, char *key, void *value, int len)
{
   int i;
   for (i=0; i < stb_arr_len(z->data); ++i) {
      if (!stb_stricmp(z->data[i].key, key)) {
         int n = stb_min(len, z->data[i].value_len);
         memcpy(value, z->data[i].value, n);
         if (n < len)
            *((char *) value + n) = 0;
         return 1;
      }
   }
   return 0;
}